

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineStatusOutput.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_d9475::CommandLineStatusOutputImpl::writeText
          (CommandLineStatusOutputImpl *this,string *text)

{
  if (this->fp == (FILE *)0x0) {
    __assert_fail("isOpen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandLineStatusOutput.cpp"
                  ,0xce,
                  "void (anonymous namespace)::CommandLineStatusOutputImpl::writeText(std::string &&)"
                 );
  }
  if ((text->_M_string_length != 0) &&
     ((text->_M_dataplus)._M_p[text->_M_string_length - 1] == '\n')) {
    if (this->hasOutput == true) {
      clearOutput(this);
    }
    stripColorCodes(this,text);
    fwrite((text->_M_dataplus)._M_p,text->_M_string_length,1,(FILE *)this->fp);
    fflush((FILE *)this->fp);
    return;
  }
  __assert_fail("text.size() && text.back() == \'\\n\'",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandLineStatusOutput.cpp"
                ,0xcf,
                "void (anonymous namespace)::CommandLineStatusOutputImpl::writeText(std::string &&)"
               );
}

Assistant:

bool isOpen() const {
    return fp != nullptr;
  }